

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  char cVar1;
  undefined2 uVar2;
  u32 uVar3;
  long lVar4;
  Expr *pEVar5;
  Expr *pEVar6;
  int regFree1;
  Expr exprAnd;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  
  regFree1 = 0;
  exprAnd.pLeft = &compLeft;
  compLeft.op = '\0';
  compLeft.affinity = '\0';
  compLeft._2_2_ = 0;
  compLeft.flags = 0;
  compLeft.u.zToken = (char *)0x0;
  compLeft.pTab = (Table *)0x0;
  compLeft.x.pList = (ExprList *)0x0;
  compLeft.nHeight = 0;
  compLeft.iTable = 0;
  compLeft.iColumn = 0;
  compLeft.iAgg = 0;
  compLeft.iRightJoinTable = 0;
  compLeft.op2 = '\0';
  compLeft._55_1_ = 0;
  compLeft.pAggInfo = (AggInfo *)0x0;
  exprAnd.pRight = &compRight;
  compRight.op = '\0';
  compRight.affinity = '\0';
  compRight._2_2_ = 0;
  compRight.flags = 0;
  compRight.u.zToken = (char *)0x0;
  compRight.pTab = (Table *)0x0;
  compRight.x.pList = (ExprList *)0x0;
  compRight.nHeight = 0;
  compRight.iTable = 0;
  compRight.iColumn = 0;
  compRight.iAgg = 0;
  compRight.iRightJoinTable = 0;
  compRight.op2 = '\0';
  compRight._55_1_ = 0;
  compRight.pAggInfo = (AggInfo *)0x0;
  exprAnd.u.zToken = (char *)0x0;
  exprAnd.x.pList = (ExprList *)0x0;
  exprAnd.nHeight = 0;
  exprAnd.iTable = 0;
  exprAnd.pTab = (Table *)0x0;
  exprAnd.iColumn = 0;
  exprAnd.iAgg = 0;
  exprAnd.iRightJoinTable = 0;
  exprAnd.op2 = '\0';
  exprAnd._55_1_ = 0;
  exprAnd.pAggInfo = (AggInfo *)0x0;
  pEVar5 = pExpr->pLeft;
  pEVar6 = &exprX;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    cVar1 = pEVar5->affinity;
    uVar2 = *(undefined2 *)&pEVar5->field_0x2;
    uVar3 = pEVar5->flags;
    pEVar6->op = pEVar5->op;
    pEVar6->affinity = cVar1;
    *(undefined2 *)&pEVar6->field_0x2 = uVar2;
    pEVar6->flags = uVar3;
    pEVar5 = (Expr *)&pEVar5->u;
    pEVar6 = (Expr *)&pEVar6->u;
  }
  exprAnd.op = 'G';
  exprAnd.affinity = '\0';
  exprAnd._2_2_ = 0;
  exprAnd.flags = 0;
  compLeft.op = 'R';
  compLeft.pRight = *(Expr **)&((pExpr->x).pSelect)->op;
  compRight.op = 'P';
  compRight.pRight = ((pExpr->x).pSelect)->pWhere;
  compRight.pLeft = &exprX;
  compLeft.pLeft = &exprX;
  exprX.iTable = exprCodeVector(pParse,&exprX,&regFree1);
  exprX.op2 = exprX.op;
  exprX.op = 0x9d;
  exprX.flags = exprX.flags & 0xffffefff;
  if (xJump == (_func_void_Parse_ptr_Expr_ptr_int_int *)0x0) {
    exprX.flags = exprX.flags | 1;
    sqlite3ExprCodeTarget(pParse,&exprAnd,dest);
  }
  else {
    (*xJump)(pParse,&exprAnd,dest,jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse,regFree1);
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
 Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */


  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprX = *pExpr->pLeft;
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprToRegister(&exprX, exprCodeVector(pParse, &exprX, &regFree1));
  if( xJump ){
    xJump(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    /* Mark the expression is being from the ON or USING clause of a join
    ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
    ** it into the Parse.pConstExpr list.  We should use a new bit for this,
    ** for clarity, but we are out of bits in the Expr.flags field so we
    ** have to reuse the EP_FromJoin bit.  Bummer. */
    exprX.flags |= EP_FromJoin;
    sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}